

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImGui::ShadeVertsLinearUV
               (ImDrawList *draw_list,int vert_start_idx,int vert_end_idx,ImVec2 *a,ImVec2 *b,
               ImVec2 *uv_a,ImVec2 *uv_b,bool clamp)

{
  ImVec2 IVar1;
  ImDrawVert *pIVar2;
  ImDrawVert *vertex;
  ImDrawVert *pIVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  auVar4._8_8_ = 0;
  auVar4._0_4_ = b->x;
  auVar4._4_4_ = b->y;
  auVar5._8_8_ = 0;
  auVar5._0_4_ = a->x;
  auVar5._4_4_ = a->y;
  auVar5 = vsubps_avx(auVar4,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_4_ = uv_b->x;
  auVar6._4_4_ = uv_b->y;
  auVar9._8_8_ = 0;
  auVar9._0_4_ = uv_a->x;
  auVar9._4_4_ = uv_a->y;
  auVar7 = vsubps_avx(auVar6,auVar9);
  auVar4 = vcmpps_avx(auVar5,ZEXT816(0) << 0x40,4);
  auVar5 = vdivps_avx(auVar7,auVar5);
  auVar4 = vandps_avx(auVar4,auVar5);
  pIVar2 = (draw_list->VtxBuffer).Data;
  pIVar3 = pIVar2 + vert_start_idx;
  pIVar2 = pIVar2 + vert_end_idx;
  if (clamp) {
    if (vert_start_idx < vert_end_idx) {
      auVar7 = vminps_avx(auVar9,auVar6);
      auVar5 = vcmpps_avx(auVar6,auVar9,2);
      auVar5 = vblendvps_avx(auVar6,auVar9,auVar5);
      do {
        auVar10._8_8_ = 0;
        auVar10._0_4_ = (pIVar3->pos).x;
        auVar10._4_4_ = (pIVar3->pos).y;
        auVar13._8_8_ = 0;
        auVar13._0_4_ = a->x;
        auVar13._4_4_ = a->y;
        auVar6 = vsubps_avx(auVar10,auVar13);
        auVar11._0_4_ = (*uv_a).x + auVar4._0_4_ * auVar6._0_4_;
        auVar11._4_4_ = (*uv_a).y + auVar4._4_4_ * auVar6._4_4_;
        auVar11._8_4_ = auVar4._8_4_ * auVar6._8_4_ + 0.0;
        auVar11._12_4_ = auVar4._12_4_ * auVar6._12_4_ + 0.0;
        auVar6 = vcmpps_avx(auVar11,auVar7,1);
        auVar9 = vminps_avx(auVar5,auVar11);
        auVar6 = vblendvps_avx(auVar9,auVar7,auVar6);
        IVar1 = (ImVec2)vmovlps_avx(auVar6);
        pIVar3->uv = IVar1;
        pIVar3 = pIVar3 + 1;
      } while (pIVar3 < pIVar2);
    }
  }
  else if (vert_start_idx < vert_end_idx) {
    do {
      auVar7._8_8_ = 0;
      auVar7._0_4_ = (pIVar3->pos).x;
      auVar7._4_4_ = (pIVar3->pos).y;
      auVar12._8_8_ = 0;
      auVar12._0_4_ = a->x;
      auVar12._4_4_ = a->y;
      auVar5 = vsubps_avx(auVar7,auVar12);
      auVar8._0_4_ = (*uv_a).x + auVar4._0_4_ * auVar5._0_4_;
      auVar8._4_4_ = (*uv_a).y + auVar4._4_4_ * auVar5._4_4_;
      auVar8._8_4_ = auVar4._8_4_ * auVar5._8_4_ + 0.0;
      auVar8._12_4_ = auVar4._12_4_ * auVar5._12_4_ + 0.0;
      IVar1 = (ImVec2)vmovlps_avx(auVar8);
      pIVar3->uv = IVar1;
      pIVar3 = pIVar3 + 1;
    } while (pIVar3 < pIVar2);
  }
  return;
}

Assistant:

void ImGui::ShadeVertsLinearUV(ImDrawList* draw_list, int vert_start_idx, int vert_end_idx, const ImVec2& a, const ImVec2& b, const ImVec2& uv_a, const ImVec2& uv_b, bool clamp)
{
    const ImVec2 size = b - a;
    const ImVec2 uv_size = uv_b - uv_a;
    const ImVec2 scale = ImVec2(
        size.x != 0.0f ? (uv_size.x / size.x) : 0.0f,
        size.y != 0.0f ? (uv_size.y / size.y) : 0.0f);

    ImDrawVert* vert_start = draw_list->VtxBuffer.Data + vert_start_idx;
    ImDrawVert* vert_end = draw_list->VtxBuffer.Data + vert_end_idx;
    if (clamp)
    {
        const ImVec2 min = ImMin(uv_a, uv_b);
        const ImVec2 max = ImMax(uv_a, uv_b);
        for (ImDrawVert* vertex = vert_start; vertex < vert_end; ++vertex)
            vertex->uv = ImClamp(uv_a + ImMul(ImVec2(vertex->pos.x, vertex->pos.y) - a, scale), min, max);
    }
    else
    {
        for (ImDrawVert* vertex = vert_start; vertex < vert_end; ++vertex)
            vertex->uv = uv_a + ImMul(ImVec2(vertex->pos.x, vertex->pos.y) - a, scale);
    }
}